

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderMarkerPlus
               (ImDrawList *DrawList,ImVec2 *c,float s,bool param_4,ImU32 col_outline,bool param_6,
               ImU32 param_7,float weight)

{
  ImVec2 local_48;
  ImVec2 IStack_40;
  ImVec2 local_38;
  ImVec2 aIStack_30 [2];
  
  aIStack_30[0].x = c->x;
  aIStack_30[0].y = c->y;
  local_48.x = s * 1.0 + aIStack_30[0].x;
  IStack_40.x = s * 0.0 + aIStack_30[0].x;
  local_38.x = s * -1.0 + aIStack_30[0].x;
  aIStack_30[0].x = s * 0.0 + aIStack_30[0].x;
  local_48.y = s * 0.0 + aIStack_30[0].y;
  IStack_40.y = s * -1.0 + aIStack_30[0].y;
  local_38.y = s * 0.0 + aIStack_30[0].y;
  aIStack_30[0].y = s * 1.0 + aIStack_30[0].y;
  ImDrawList::AddLine(DrawList,&local_48,&local_38,col_outline,weight);
  ImDrawList::AddLine(DrawList,&IStack_40,aIStack_30,col_outline,weight);
  return;
}

Assistant:

inline void RenderMarkerPlus(ImDrawList& DrawList, const ImVec2& c, float s, bool /*outline*/, ImU32 col_outline, bool /*fill*/, ImU32 /*col_fill*/, float weight) {
    ImVec2 marker[4] = {ImVec2(1, 0), ImVec2(0, -1), ImVec2(-1, 0), ImVec2(0, 1)};
    TransformMarker(marker, 4, c, s);
    DrawList.AddLine(marker[0], marker[2], col_outline, weight);
    DrawList.AddLine(marker[1], marker[3], col_outline, weight);
}